

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O3

void __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
dijkstra_get_sssp(uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                        *destination,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *predecessor)

{
  size_t *psVar1;
  _Node *p_Var2;
  _List_node_base *p_Var3;
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  local_30;
  
  if (destination->_M_string_length != 0) {
    do {
      p_Var2 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          &this->path,destination);
      std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
      psVar1 = &(this->path).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](predecessor,destination);
      std::__cxx11::string::_M_assign((string *)destination);
    } while (destination->_M_string_length != 0);
  }
  std::__detail::_List_node_base::_M_reverse();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t\t",3);
  p_Var3 = (this->path).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_30._M_stream = (ostream_type *)&std::cout;
  local_30._M_string = "\n\t\t\t";
  if (p_Var3 != (_List_node_base *)&this->path) {
    do {
      std::
      ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
      ::operator=(&local_30,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1))
      ;
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->path);
  }
  return;
}

Assistant:

void dijkstra_get_sssp(ver destination, map<ver, ver> &predecessor) {
      for (; !destination.empty(); destination = predecessor[destination]) {
        path.push_back(destination);
      }
      path.reverse();
      cout << "\t\t\t";
      copy(all(path), ostream_iterator<ver>(cout, "\n\t\t\t"));
    }